

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.cc
# Opt level: O3

int wrap_qpdfjob(qpdfjob_handle j,function<int_(_qpdfjob_handle_*)> *fn)

{
  int iVar1;
  qpdfjob_handle local_40 [5];
  
  local_40[0] = j;
  if ((fn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    iVar1 = (*fn->_M_invoker)((_Any_data *)fn,local_40);
    return iVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

static int
wrap_qpdfjob(qpdfjob_handle j, std::function<int(qpdfjob_handle j)> fn)
{
    try {
        return fn(j);
    } catch (std::exception& e) {
        *j->j.getLogger()->getError() << j->j.getMessagePrefix() << ": " << e.what() << "\n";
    }
    return QPDFJob::EXIT_ERROR;
}